

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# univalue_write.cpp
# Opt level: O2

void __thiscall UniValue::writeObject(UniValue *this,uint prettyIndent,uint indentLevel,string *s)

{
  UniValue *this_00;
  pointer pbVar1;
  const_reference pvVar2;
  uint uVar3;
  ulong __n;
  long in_FS_OFFSET;
  string local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78 [2];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append(s,"{");
  if (prettyIndent != 0) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append(s,"\n");
  }
  uVar3 = 0;
  while( true ) {
    __n = (ulong)uVar3;
    pbVar1 = (this->keys).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->keys).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5) <= __n) break;
    if (prettyIndent != 0) {
      indentStr(prettyIndent,indentLevel,s);
      pbVar1 = (this->keys).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    }
    json_escape(&local_98,pbVar1 + __n);
    std::operator+(local_78,"\"",&local_98);
    this_00 = (UniValue *)(local_78 + 1);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
                   local_78,"\":");
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (s,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
    std::__cxx11::string::~string((string *)this_00);
    std::__cxx11::string::~string((string *)local_78);
    std::__cxx11::string::~string((string *)&local_98);
    if (prettyIndent != 0) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append(s," ")
      ;
    }
    pvVar2 = std::vector<UniValue,_std::allocator<UniValue>_>::at(&this->values,__n);
    write_abi_cxx11_(this_00,(int)pvVar2,(void *)(ulong)prettyIndent,(ulong)(indentLevel + 1));
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (s,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
    std::__cxx11::string::~string((string *)this_00);
    if (((long)(this->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
               super__Vector_impl_data._M_finish -
        (long)(this->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
              super__Vector_impl_data._M_start) / 0x58 - 1U != __n) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append(s,",")
      ;
    }
    if (prettyIndent != 0) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (s,"\n");
    }
    uVar3 = uVar3 + 1;
  }
  if (prettyIndent != 0) {
    indentStr(prettyIndent,indentLevel - 1,s);
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append(s,"}");
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void UniValue::writeObject(unsigned int prettyIndent, unsigned int indentLevel, std::string& s) const
{
    s += "{";
    if (prettyIndent)
        s += "\n";

    for (unsigned int i = 0; i < keys.size(); i++) {
        if (prettyIndent)
            indentStr(prettyIndent, indentLevel, s);
        s += "\"" + json_escape(keys[i]) + "\":";
        if (prettyIndent)
            s += " ";
        s += values.at(i).write(prettyIndent, indentLevel + 1);
        if (i != (values.size() - 1))
            s += ",";
        if (prettyIndent)
            s += "\n";
    }

    if (prettyIndent)
        indentStr(prettyIndent, indentLevel - 1, s);
    s += "}";
}